

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O3

ChNodeFEAxyzrot * __thiscall
chrono::fea::ChNodeFEAxyzrot::operator=(ChNodeFEAxyzrot *this,ChNodeFEAxyzrot *other)

{
  if (other != this) {
    ChNodeBase::operator=
              ((ChNodeBase *)
               ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
               (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3]),
               (ChNodeBase *)
               ((long)&(other->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
               (long)(other->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3]));
    (this->super_ChNodeFEAbase).m_TotalMass = (other->super_ChNodeFEAbase).m_TotalMass;
    (this->super_ChNodeFEAbase).g_index = (other->super_ChNodeFEAbase).g_index;
    ChFrameMoving<double>::operator=
              ((ChFrameMoving<double> *)&(this->super_ChNodeFEAbase).field_0x18,
               (ChFrameMoving<double> *)&(other->super_ChNodeFEAbase).field_0x18);
    ChFrame<double>::operator=(&this->X0,&other->X0);
    (this->Force).m_data[0] = (other->Force).m_data[0];
    (this->Force).m_data[1] = (other->Force).m_data[1];
    (this->Force).m_data[2] = (other->Force).m_data[2];
    (this->Torque).m_data[0] = (other->Torque).m_data[0];
    (this->Torque).m_data[1] = (other->Torque).m_data[1];
    (this->Torque).m_data[2] = (other->Torque).m_data[2];
    ChVariablesBodyOwnMass::operator=(&this->variables,&other->variables);
  }
  return this;
}

Assistant:

ChNodeFEAxyzrot& ChNodeFEAxyzrot::operator=(const ChNodeFEAxyzrot& other) {
    if (&other == this)
        return *this;

    ChNodeFEAbase::operator=(other);
    ChBodyFrame::operator=(other);

    X0 = other.X0;

    Force = other.Force;
    Torque = other.Torque;

    variables = other.variables;

    return *this;
}